

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O2

void __thiscall Pl_Flate::checkError(Pl_Flate *this,char *prefix,int error_code)

{
  Members *pMVar1;
  void *pvVar2;
  runtime_error *this_00;
  char *__rhs;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string msg;
  
  if (error_code != 0) {
    pMVar1 = (this->m)._M_t.
             super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>._M_t.
             super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
             super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl;
    pvVar2 = pMVar1->zdata;
    __rhs = "inflate";
    if (pMVar1->action == a_deflate) {
      __rhs = "deflate";
    }
    std::operator+(&local_68,&(this->super_Pipeline).identifier,": ");
    std::operator+(&local_c8,&local_68,__rhs);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(&local_88,&local_a8,prefix);
    std::operator+(&msg,&local_88,": ");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_68);
    if ((*(long *)((long)pvVar2 + 0x30) == 0) && ((uint)error_code < 0xfffffffa)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"zlib unknown error (",&local_c9);
      std::__cxx11::to_string(&local_68,error_code);
      std::operator+(&local_a8,&local_c8,&local_68);
      std::operator+(&local_88,&local_a8,")");
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    else {
      std::__cxx11::string::append((char *)&msg);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,(string *)&msg);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void
Pl_Flate::checkError(char const* prefix, int error_code)
{
    z_stream& zstream = *(static_cast<z_stream*>(m->zdata));
    if (error_code != Z_OK) {
        char const* action_str = (m->action == a_deflate ? "deflate" : "inflate");
        std::string msg = this->identifier + ": " + action_str + ": " + prefix + ": ";

        if (zstream.msg) {
            msg += zstream.msg;
        } else {
            switch (error_code) {
            case Z_ERRNO:
                msg += "zlib system error";
                break;

            case Z_STREAM_ERROR:
                msg += "zlib stream error";
                break;

            case Z_DATA_ERROR:
                msg += "zlib data error";
                break;

            case Z_MEM_ERROR:
                msg += "zlib memory error";
                break;

            case Z_BUF_ERROR:
                msg += "zlib buffer error";
                break;

            case Z_VERSION_ERROR:
                msg += "zlib version error";
                break;

            default:
                msg += std::string("zlib unknown error (") + std::to_string(error_code) + ")";
                break;
            }
        }

        throw std::runtime_error(msg);
    }
}